

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

history_t * lat_entry(snode_t *s)

{
  history_t *phVar1;
  history_t *h;
  snode_t *s_local;
  
  phVar1 = (history_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                          ,0x3d2);
  phVar1->snode = s;
  phVar1->score = s->newscore;
  phVar1->pred = s->newhist;
  phVar1->alloc_next = hist_head;
  hist_head = phVar1;
  return phVar1;
}

Assistant:

static history_t *
lat_entry(snode_t * s)
{
    history_t *h;

    h = (history_t *) ckd_calloc(1, sizeof(*h));
    h->snode = s;
    h->score = s->newscore;
    h->pred = s->newhist;

    h->alloc_next = hist_head;
    hist_head = h;

    return h;
}